

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O1

string * __thiscall clunk::Clunk::GetFEN_abi_cxx11_(string *__return_storage_ptr__,Clunk *this)

{
  Output OStack_18;
  
  if (this->root == (Node *)0x0) {
    senjo::Output::Output(&OStack_18,InfoPrefix);
    senjo::Output::operator<<(&OStack_18,&NOT_INITIALIZED);
    senjo::Output::~Output(&OStack_18);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    Node::GetFEN_abi_cxx11_(__return_storage_ptr__,this->root);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Clunk::GetFEN() const {
  if (!root) {
    senjo::Output() << NOT_INITIALIZED;
    return std::string();
  }
  return root->GetFEN();
}